

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O2

void ImGuizmo::Manipulate
               (float *view,float *projection,OPERATION operation,MODE mode,float *matrix,
               float *deltaMatrix,float *snap,float *localBounds,float *boundsSnap)

{
  long lVar1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ImDrawList *pIVar12;
  MODE MVar13;
  undefined4 uVar14;
  int i;
  int type;
  ImGuiIO *pIVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  undefined4 uVar19;
  uint uVar20;
  undefined8 uVar21;
  ImGuiIO *pIVar22;
  matrix_t *buf;
  int iVar23;
  ImU32 col;
  vec_t *extraout_RDX;
  vec_t *extraout_RDX_00;
  vec_t *plan;
  vec_t *extraout_RDX_01;
  vec_t *plan_00;
  vec_t *plan_01;
  vec_t *plan_02;
  vec_t *extraout_RDX_02;
  undefined8 extraout_RDX_03;
  vec_t *pvVar24;
  vec_t *extraout_RDX_04;
  vec_t *extraout_RDX_05;
  int j;
  int iVar25;
  ImU32 col_00;
  float (*pafVar26) [4];
  uint i_1;
  ulong uVar27;
  vec_t *pvVar28;
  ImGuiIO *rVector;
  ImGuiIO *centre;
  int iVar29;
  vec_t *pvVar30;
  long lVar31;
  ImGuiIO *pIVar32;
  int iVar33;
  undefined1 *puVar34;
  long lVar35;
  bool bVar36;
  int i_3;
  ImU32 IVar37;
  ImGuiIO *pIVar38;
  bool bVar39;
  ImVec2 IVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  vec_t vVar49;
  vec_t vVar50;
  float local_6d8;
  float fStack_6d4;
  float local_6c8;
  float fStack_6c4;
  float local_6a8;
  float fStack_6a4;
  float local_678;
  float fStack_674;
  ulong local_668;
  matrix_t matT_3;
  float local_618;
  float local_608;
  vec_t cumulativeDelta;
  matrix_t viewInverse;
  vec_t bestAxisWorldDirection;
  float local_558;
  float local_548;
  int indices [2];
  vec_t newPos;
  matrix_t matT;
  matrix_t matT_11;
  matrix_t res_1;
  matrix_t matT_2;
  vec_t local_48;
  
  _DAT_001f104c = *(undefined8 *)view;
  uRam00000000001f1054 = *(undefined8 *)(view + 2);
  _DAT_001f105c = *(undefined8 *)(view + 4);
  uRam00000000001f1064 = *(undefined8 *)(view + 6);
  _DAT_001f106c = *(undefined8 *)(view + 8);
  uRam00000000001f1074 = *(undefined8 *)(view + 10);
  _DAT_001f107c = *(undefined8 *)(view + 0xc);
  uRam00000000001f1084 = *(undefined8 *)(view + 0xe);
  _DAT_001f108c = *(undefined8 *)projection;
  uRam00000000001f1094 = *(undefined8 *)(projection + 2);
  _DAT_001f109c = *(undefined8 *)(projection + 4);
  uRam00000000001f10a4 = *(undefined8 *)(projection + 6);
  _DAT_001f10ac = *(undefined8 *)(projection + 8);
  uRam00000000001f10b4 = *(undefined8 *)(projection + 10);
  _DAT_001f10bc = *(undefined8 *)(projection + 0xc);
  uRam00000000001f10c4 = *(undefined8 *)(projection + 0xe);
  DAT_001f1048 = mode;
  if (mode == LOCAL) {
    _DAT_001f10cc = *(undefined8 *)matrix;
    _DAT_001f10d4 = *(undefined8 *)(matrix + 2);
    _DAT_001f10dc = *(undefined8 *)(matrix + 4);
    uRam00000000001f10e4 = *(undefined8 *)(matrix + 6);
    _DAT_001f10ec = *(undefined8 *)(matrix + 8);
    uRam00000000001f10f4 = *(undefined8 *)(matrix + 10);
    _DAT_001f10fc = *(undefined8 *)(matrix + 0xc);
    uRam00000000001f1104 = *(undefined8 *)(matrix + 0xe);
    matrix_t::OrthoNormalize((matrix_t *)&DAT_001f10cc);
  }
  else {
    matrix_t::Translation((matrix_t *)&DAT_001f10cc,(vec_t *)(matrix + 0xc));
  }
  uVar21 = *(undefined8 *)matrix;
  uVar4 = *(undefined8 *)*(undefined1 (*) [12])(matrix + 2);
  auVar6 = *(undefined1 (*) [12])(matrix + 2);
  _DAT_001f1164 = *(undefined8 *)(matrix + 6);
  uVar5 = *(undefined8 *)(matrix + 8);
  _DAT_001f1174 = *(undefined8 *)(matrix + 10);
  _DAT_001f117c = *(undefined8 *)(matrix + 0xc);
  uRam00000000001f1184 = *(undefined8 *)(matrix + 0xe);
  _DAT_001f1154 = (float)uVar4;
  fRam00000000001f1158 = (float)((ulong)uVar4 >> 0x20);
  DAT_001f115c = (float)*(undefined8 *)(matrix + 4);
  DAT_001f1160 = (float)((ulong)*(undefined8 *)(matrix + 4) >> 0x20);
  _DAT_001f114c = (float)uVar21;
  _DAT_001f1150 = (float)((ulong)uVar21 >> 0x20);
  auVar41._12_4_ = DAT_001f1160;
  auVar41._0_12_ = auVar6;
  DAT_001f116c = (float)uVar5;
  DAT_001f1170 = (float)((ulong)uVar5 >> 0x20);
  DAT_001f1254 = SQRT(DAT_001f1174 * DAT_001f1174 +
                      DAT_001f116c * DAT_001f116c + DAT_001f1170 * DAT_001f1170);
  auVar45._0_4_ =
       auVar6._0_4_ * auVar6._0_4_ + _DAT_001f114c * _DAT_001f114c + _DAT_001f1150 * _DAT_001f1150;
  auVar45._4_4_ =
       DAT_001f1164 * DAT_001f1164 + DAT_001f115c * DAT_001f115c + DAT_001f1160 * DAT_001f1160;
  auVar45._8_4_ =
       auVar6._8_4_ * auVar6._8_4_ +
       _DAT_001f1154 * _DAT_001f1154 + fRam00000000001f1158 * fRam00000000001f1158;
  auVar45._12_4_ =
       DAT_001f1160 * DAT_001f1160 +
       fRam00000000001f1158 * fRam00000000001f1158 + DAT_001f115c * DAT_001f115c;
  auVar41 = sqrtps(auVar41,auVar45);
  _DAT_001f124c = auVar41._0_8_;
  _DAT_001f1258 = 0;
  _DAT_001f114c = uVar21;
  _DAT_001f116c = uVar5;
  matrix_t::Inverse((matrix_t *)&DAT_001f110c,(matrix_t *)&DAT_001f10cc,false);
  matrix_t::Inverse((matrix_t *)&DAT_001f118c,(matrix_t *)&DAT_001f114c,false);
  FPU_MatrixF_x_MatrixF((float *)&DAT_001f104c,(float *)&DAT_001f108c,(float *)&matT);
  _DAT_001f120c = CONCAT44(matT.field_0.m[0][1],matT.field_0.m[0][0]);
  uRam00000000001f1214 = CONCAT44(matT.field_0.m[0][3],matT.field_0.m[0][2]);
  _DAT_001f121c = CONCAT44(matT.field_0.m[1][1],matT.field_0.m[1][0]);
  uRam00000000001f1234 = CONCAT44(matT.field_0.m[2][3],matT.field_0.m[2][2]);
  _DAT_001f123c = CONCAT44(matT.field_0.m[3][1],matT.field_0.m[3][0]);
  uRam00000000001f1244 = CONCAT44(matT.field_0.m[3][3],matT.field_0.m[3][2]);
  _DAT_001f122c = matT.field_0._32_8_;
  uRam00000000001f1224 = matT.field_0._24_8_;
  FPU_MatrixF_x_MatrixF((float *)&DAT_001f10cc,(float *)&DAT_001f120c,(float *)&matT);
  _DAT_001f11cc = CONCAT44(matT.field_0.m[0][1],matT.field_0.m[0][0]);
  uRam00000000001f11d4 = CONCAT44(matT.field_0.m[0][3],matT.field_0.m[0][2]);
  _DAT_001f11dc = CONCAT44(matT.field_0.m[1][1],matT.field_0.m[1][0]);
  uRam00000000001f11f4 = CONCAT44(matT.field_0.m[2][3],matT.field_0.m[2][2]);
  _DAT_001f11fc = CONCAT44(matT.field_0.m[3][1],matT.field_0.m[3][0]);
  uRam00000000001f1204 = CONCAT44(matT.field_0.m[3][3],matT.field_0.m[3][2]);
  _DAT_001f11ec = matT.field_0._32_8_;
  uRam00000000001f11e4 = matT.field_0._24_8_;
  matrix_t::Inverse(&viewInverse,(matrix_t *)&DAT_001f104c,false);
  _DAT_001f127c = viewInverse.field_0._32_8_;
  uRam00000000001f1284 = viewInverse.field_0._40_8_;
  _DAT_001f125c = viewInverse.field_0._48_8_;
  uRam00000000001f1264 = viewInverse.field_0._56_8_;
  _DAT_001f126c = viewInverse.field_0._0_8_;
  uRam00000000001f1274 = viewInverse.field_0._8_8_;
  _DAT_001f128c = viewInverse.field_0._16_8_;
  uRam00000000001f1294 = viewInverse.field_0._24_8_;
  matT.field_0.m[0][0] = _DAT_001f10fc;
  matT.field_0.m[0][1] = DAT_001f10fc_4;
  matT.field_0.m[0][2] = (float)uRam00000000001f1104;
  matT.field_0.m[0][3] = 1.0;
  vec_t::Transform((vec_t *)&matT,(matrix_t *)&DAT_001f120c);
  DAT_001f12d4 = matT.field_0.m[0][3] * 0.1;
  matT.field_0.m[0][0] = 0.0;
  matT.field_0.m[0][1] = 0.0;
  matT.field_0.m[0][2] = 0.0;
  matT.field_0.m[0][3] = 0.0;
  _DAT_001f12bc = worldToPos((vec_t *)&matT,(matrix_t *)&DAT_001f11cc);
  _DAT_001f12c4 = (float)DAT_001f12bc + -10.0;
  DAT_001f12c8 = DAT_001f12bc._4_4_ + -10.0;
  DAT_001f12cc = (float)DAT_001f12bc + 10.0;
  DAT_001f12d0 = DAT_001f12bc._4_4_ + 10.0;
  pIVar15 = ImGui::GetIO();
  FPU_MatrixF_x_MatrixF((float *)&DAT_001f104c,(float *)&DAT_001f108c,(float *)&matT_2);
  matrix_t::Inverse(&matT,&matT_2,false);
  fVar46 = ((pIVar15->MousePos).x - (float)DAT_001f1400) / (float)DAT_001f1408;
  fVar43 = 1.0 - ((pIVar15->MousePos).y - DAT_001f1400._4_4_) / DAT_001f1408._4_4_;
  fVar46 = fVar46 + fVar46 + -1.0;
  fVar43 = fVar43 + fVar43 + -1.0;
  _DAT_001f129c = CONCAT44(fVar43,fVar46);
  uRam00000000001f12a4 = 0x3f80000000000000;
  vec_t::Transform((vec_t *)&DAT_001f129c,&matT);
  vec_t::operator*=((vec_t *)&DAT_001f129c,1.0 / _DAT_001f12a8);
  matT_2.field_0.m[0][2] = 1.0;
  matT_2.field_0.m[0][3] = 1.0;
  pvVar24 = (vec_t *)&matT_2;
  matT_2.field_0.m[0][0] = fVar46;
  matT_2.field_0.m[0][1] = fVar43;
  vec_t::Transform(pvVar24,&matT);
  fVar43 = 1.0 / matT_2.field_0.m[0][3];
  matT_2.field_0.m[0][0] = fVar43 * matT_2.field_0.m[0][0];
  matT_2.field_0.m[0][1] = fVar43 * matT_2.field_0.m[0][1];
  matT_2.field_0.m[0][2] = fVar43 * matT_2.field_0.m[0][2];
  matT_2.field_0.m[0][3] = fVar43 * matT_2.field_0.m[0][3];
  vVar49 = vec_t::operator-(pvVar24,(vec_t *)&DAT_001f129c);
  matT_3.field_0.m[0][0] = vVar49.x;
  matT_3.field_0.m[0][1] = vVar49.y;
  matT_3.field_0.m[0][2] = vVar49.z;
  matT_3.field_0.m[0][3] = vVar49.w;
  _DAT_001f12ac = Normalized((vec_t *)&matT_3);
  if (deltaMatrix != (float *)0x0) {
    *deltaMatrix = 1.0;
    deltaMatrix[1] = 0.0;
    deltaMatrix[2] = 0.0;
    deltaMatrix[3] = 0.0;
    deltaMatrix[4] = 0.0;
    deltaMatrix[5] = 1.0;
    deltaMatrix[6] = 0.0;
    deltaMatrix[7] = 0.0;
    deltaMatrix[8] = 0.0;
    deltaMatrix[9] = 0.0;
    deltaMatrix[10] = 1.0;
    deltaMatrix[0xb] = 0.0;
    deltaMatrix[0xc] = 0.0;
    deltaMatrix[0xd] = 0.0;
    deltaMatrix[0xe] = 0.0;
    deltaMatrix[0xf] = 1.0;
  }
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  local_48.w = 0.0;
  pvVar28 = (vec_t *)&DAT_001f11cc;
  vec_t::TransformPoint(&local_48,(matrix_t *)&DAT_001f11cc);
  if (local_48.z < 0.001) {
    return;
  }
  type = 0;
  if ((DAT_001f12e9 != 1) || (DAT_001f13b8 != 0)) goto LAB_0012c046;
  if (operation == TRANSLATE) {
    pIVar15 = ImGui::GetIO();
    MVar13 = DAT_001f1048;
    if (DAT_001f12e8 != '\x01') {
      type = GetMoveType((vec_t *)&matT_2);
      if ((type != 0) && (pIVar15->MouseDown[0] != false)) {
        DAT_001f12e8 = '\x01';
        matT.field_0.m[0][0] = (float)_DAT_001f10dc;
        matT.field_0.m[0][1] = (float)((ulong)_DAT_001f10dc >> 0x20);
        matT.field_0.m[0][2] = (float)uRam00000000001f10e4;
        matT.field_0.m[0][3] = (float)((ulong)uRam00000000001f10e4 >> 0x20);
        matT.field_0.m[1][0] = (float)_DAT_001f10ec;
        matT.field_0.m[1][1] = (float)((ulong)_DAT_001f10ec >> 0x20);
        matT.field_0._24_8_ = uRam00000000001f10f4;
        matT.field_0._32_8_ = _DAT_001f10cc;
        matT.field_0.m[2][2] = (float)_DAT_001f10d4;
        matT.field_0.m[2][3] = (float)((ulong)_DAT_001f10d4 >> 0x20);
        matT.field_0.m[3][2] = (float)uRam00000000001f10f4;
        matT.field_0.m[3][3] = (float)((ulong)uRam00000000001f10f4 >> 0x20);
        DAT_001f13fc = type;
        matT.field_0.m[3][0] = matT.field_0.m[1][0];
        matT.field_0.m[3][1] = matT.field_0.m[1][1];
        vec_t::operator-((vec_t *)&DAT_001f127c);
        pvVar28 = &newPos + type;
        _DAT_001f12ec = BuildPlan((vec_t *)&DAT_001f10fc,pvVar28);
        fVar43 = IntersectRayPlane((vec_t *)&DAT_001f12ec,pvVar28,plan_01);
        viewInverse.field_0.v.right = vec_t::operator*((vec_t *)&DAT_001f12ac,fVar43);
        _DAT_001f12fc = vec_t::operator+((vec_t *)&DAT_001f129c,(vec_t *)&viewInverse);
        _DAT_001f130c = _DAT_001f10fc;
        uRam00000000001f1314 = uRam00000000001f1104;
        vVar49 = vec_t::operator-((vec_t *)&DAT_001f12fc,(vec_t *)&DAT_001f10fc);
        fVar43 = 1.0 / DAT_001f12d4;
        _DAT_001f12d8 = CONCAT44(vVar49.y * fVar43,vVar49.x * fVar43);
        uRam00000000001f12e0 = CONCAT44(fVar43 * vVar49.w,fVar43 * vVar49.z);
      }
      goto LAB_0012c046;
    }
    fVar43 = IntersectRayPlane((vec_t *)&DAT_001f12ec,pvVar28,plan_00);
    vVar49 = vec_t::operator*((vec_t *)&DAT_001f12ac,fVar43);
    matT.field_0.m[0][0] = vVar49.x;
    matT.field_0.m[0][1] = vVar49.y;
    matT.field_0.m[0][2] = vVar49.z;
    matT.field_0.m[0][3] = vVar49.w;
    vVar49 = vec_t::operator+((vec_t *)&DAT_001f129c,(vec_t *)&matT);
    vVar50 = vec_t::operator*((vec_t *)&DAT_001f12d8,DAT_001f12d4);
    local_6a8 = vVar49.x;
    fStack_6a4 = vVar49.y;
    local_6c8 = vVar49.z;
    fStack_6c4 = vVar49.w;
    viewInverse.field_0.m[0][1] = fStack_6a4 - vVar50.y;
    viewInverse.field_0.m[0][0] = local_6a8 - vVar50.x;
    viewInverse.field_0.m[0][2] = local_6c8 - vVar50.z;
    viewInverse.field_0.m[0][3] = fStack_6c4 - vVar50.w;
    vVar49 = vec_t::operator-((vec_t *)&viewInverse,(vec_t *)&DAT_001f10fc);
    auVar6 = vVar49._0_12_;
    matT_3.field_0.m[0][0] = vVar49.x;
    matT_3.field_0.m[0][1] = vVar49.y;
    matT_3.field_0.m[0][2] = vVar49.z;
    matT_3.field_0.m[0][3] = vVar49.w;
    if (DAT_001f13fc - 1U < 3) {
      lVar31 = (ulong)(DAT_001f13fc - 1U) * 0x10;
      vVar49 = vec_t::operator*((vec_t *)(&DAT_001f10cc + lVar31),
                                matT_3.field_0.m[0][2] * *(float *)(&DAT_001f10d4 + lVar31) +
                                ((vec_t *)(&DAT_001f10cc + lVar31))->x * matT_3.field_0.m[0][0] +
                                matT_3.field_0.m[0][1] * *(float *)(&DAT_001f10d0 + lVar31));
      auVar6 = vVar49._0_12_;
      matT_3.field_0.m[0][0] = vVar49.x;
      matT_3.field_0.m[0][1] = vVar49.y;
      matT_3.field_0.m[0][2] = vVar49.z;
      matT_3.field_0.m[0][3] = vVar49.w;
    }
    if (snap != (float *)0x0) {
      vVar49 = vec_t::operator+((vec_t *)&DAT_001f10fc,(vec_t *)&matT_3);
      matT.field_0.m[0][0] = vVar49.x;
      matT.field_0.m[0][1] = vVar49.y;
      matT.field_0.m[0][2] = vVar49.z;
      matT.field_0.m[0][3] = vVar49.w;
      vVar49 = vec_t::operator-((vec_t *)&matT,(vec_t *)&DAT_001f130c);
      cumulativeDelta.x = vVar49.x;
      cumulativeDelta.y = vVar49.y;
      cumulativeDelta.z = vVar49.z;
      cumulativeDelta.w = vVar49.w;
      if (MVar13 == LOCAL) {
        matT.field_0.m[3][0] = (float)_DAT_001f117c;
        matT.field_0.m[3][1] = (float)((ulong)_DAT_001f117c >> 0x20);
        matT.field_0.m[3][2] = (float)uRam00000000001f1184;
        matT.field_0.m[3][3] = (float)((ulong)uRam00000000001f1184 >> 0x20);
        matT.field_0._32_8_ = _DAT_001f116c;
        matT.field_0.m[2][2] = (float)_DAT_001f1174;
        matT.field_0.m[2][3] = (float)((ulong)_DAT_001f1174 >> 0x20);
        matT.field_0.m[1][0] = DAT_001f115c;
        matT.field_0.m[1][1] = DAT_001f1160;
        matT.field_0._24_8_ = _DAT_001f1164;
        matT.field_0.m[0][0] = (float)_DAT_001f114c;
        matT.field_0.m[0][1] = (float)((ulong)_DAT_001f114c >> 0x20);
        matT.field_0.m[0][2] = _DAT_001f1154;
        matT.field_0.m[0][3] = fRam00000000001f1158;
        matrix_t::OrthoNormalize(&matT);
        matrix_t::Inverse(&matT_2,&matT,false);
        vec_t::TransformVector(&cumulativeDelta,&matT_2);
        ComputeSnap(&cumulativeDelta,snap);
        vec_t::TransformVector(&cumulativeDelta,&matT);
      }
      else {
        ComputeSnap(&cumulativeDelta,snap);
      }
      vVar49 = vec_t::operator+((vec_t *)&DAT_001f130c,&cumulativeDelta);
      matT.field_0.m[0][0] = vVar49.x;
      matT.field_0.m[0][1] = vVar49.y;
      matT.field_0.m[0][2] = vVar49.z;
      matT.field_0.m[0][3] = vVar49.w;
      vVar49 = vec_t::operator-((vec_t *)&matT,(vec_t *)&DAT_001f10fc);
      auVar6 = vVar49._0_12_;
    }
    matT.field_0.m[0][0] = 1.0;
    matT.field_0.m[0][1] = 0.0;
    matT.field_0.m[0][2] = 0.0;
    matT.field_0.m[0][3] = 0.0;
    matT.field_0.m[1][0] = 0.0;
    matT.field_0.m[1][1] = 1.0;
    matT.field_0._24_8_ = 0;
    matT.field_0._32_8_ = 0;
    matT.field_0.m[3][0] = (float)auVar6._0_4_;
    matT.field_0.m[3][1] = (float)auVar6._4_4_;
    matT.field_0.m[2][2] = 1.0;
    matT.field_0.m[2][3] = 0.0;
    matT.field_0.m[3][2] = (float)auVar6._8_4_;
    matT.field_0.m[3][3] = 1.0;
    if (deltaMatrix != (float *)0x0) {
      *(long *)(deltaMatrix + 0xc) = auVar6._0_8_;
      deltaMatrix[0xe] = matT.field_0.m[3][2];
      deltaMatrix[0xf] = 1.0;
      deltaMatrix[8] = 0.0;
      deltaMatrix[9] = 0.0;
      deltaMatrix[10] = 1.0;
      deltaMatrix[0xb] = 0.0;
      deltaMatrix[4] = 0.0;
      deltaMatrix[5] = 1.0;
      deltaMatrix[6] = 0.0;
      deltaMatrix[7] = 0.0;
      *deltaMatrix = 1.0;
      deltaMatrix[1] = 0.0;
      deltaMatrix[2] = 0.0;
      deltaMatrix[3] = 0.0;
    }
    FPU_MatrixF_x_MatrixF((float *)&DAT_001f114c,(float *)&matT,(float *)&matT_2);
    auVar11._4_4_ = matT_2.field_0.m[1][1];
    auVar11._0_4_ = matT_2.field_0.m[1][0];
    auVar11._8_8_ = matT_2.field_0._24_8_;
    *(ulong *)(matrix + 0xc) = CONCAT44(matT_2.field_0.m[3][1],matT_2.field_0.m[3][0]);
    *(ulong *)(matrix + 0xe) = CONCAT44(matT_2.field_0.m[3][3],matT_2.field_0.m[3][2]);
    *(undefined8 *)(matrix + 8) = matT_2.field_0._32_8_;
    *(ulong *)(matrix + 10) = CONCAT44(matT_2.field_0.m[2][3],matT_2.field_0.m[2][2]);
    *(undefined1 (*) [16])(matrix + 4) = auVar11;
    *(ulong *)matrix = CONCAT44(matT_2.field_0.m[0][1],matT_2.field_0.m[0][0]);
    *(ulong *)(matrix + 2) = CONCAT44(matT_2.field_0.m[0][3],matT_2.field_0.m[0][2]);
    cVar2 = pIVar15->MouseDown[0];
  }
  else if (operation == SCALE) {
    pIVar15 = ImGui::GetIO();
    type = 0;
    pvVar30 = extraout_RDX;
    if (((DAT_001f12e8 == '\0') && (type = GetScaleType(), pvVar30 = extraout_RDX_00, type != 0)) &&
       (pIVar15->MouseDown[0] != false)) {
      DAT_001f12e8 = '\x01';
      matT.field_0.m[0][0] = (float)_DAT_001f10dc;
      matT.field_0.m[0][1] = (float)((ulong)_DAT_001f10dc >> 0x20);
      matT.field_0.m[0][2] = (float)uRam00000000001f10e4;
      matT.field_0.m[0][3] = (float)((ulong)uRam00000000001f10e4 >> 0x20);
      matT.field_0.m[1][0] = (float)_DAT_001f10ec;
      matT.field_0.m[1][1] = (float)((ulong)_DAT_001f10ec >> 0x20);
      matT.field_0._24_8_ = uRam00000000001f10f4;
      matT.field_0._32_8_ = _DAT_001f10cc;
      matT.field_0.m[2][2] = (float)_DAT_001f10d4;
      matT.field_0.m[2][3] = (float)((ulong)_DAT_001f10d4 >> 0x20);
      matT.field_0.m[3][2] = (float)uRam00000000001f10f4;
      matT.field_0.m[3][3] = (float)((ulong)uRam00000000001f10f4 >> 0x20);
      DAT_001f13fc = type;
      matT.field_0.m[3][0] = matT.field_0.m[1][0];
      matT.field_0.m[3][1] = matT.field_0.m[1][1];
      vec_t::operator-((vec_t *)&DAT_001f127c);
      pvVar28 = (vec_t *)((long)&viewInverse.field_0 + (long)type * 0x10 + 0x10);
      _DAT_001f12ec = BuildPlan((vec_t *)&DAT_001f10fc,pvVar28);
      fVar43 = IntersectRayPlane((vec_t *)&DAT_001f12ec,pvVar28,plan);
      vVar49 = vec_t::operator*((vec_t *)&DAT_001f12ac,fVar43);
      matT_2.field_0.m[0][0] = vVar49.x;
      matT_2.field_0.m[0][1] = vVar49.y;
      matT_2.field_0.m[0][2] = vVar49.z;
      matT_2.field_0.m[0][3] = vVar49.w;
      _DAT_001f12fc = vec_t::operator+((vec_t *)&DAT_001f129c,(vec_t *)&matT_2);
      _DAT_001f130c = _DAT_001f10fc;
      uRam00000000001f1314 = uRam00000000001f1104;
      _DAT_001f1334 = 0x3f8000003f800000;
      _DAT_001f133c = 0x3f800000;
      pvVar28 = (vec_t *)&DAT_001f10fc;
      vVar49 = vec_t::operator-((vec_t *)&DAT_001f12fc,(vec_t *)&DAT_001f10fc);
      fVar43 = 1.0 / DAT_001f12d4;
      _DAT_001f12d8 = CONCAT44(vVar49.y * fVar43,vVar49.x * fVar43);
      uRam00000000001f12e0 = CONCAT44(fVar43 * vVar49.w,fVar43 * vVar49.z);
      auVar42._0_4_ =
           _DAT_001f1154 * _DAT_001f1154 +
           _DAT_001f114c * _DAT_001f114c + _DAT_001f1150 * _DAT_001f1150;
      auVar42._4_4_ =
           DAT_001f1164 * DAT_001f1164 + DAT_001f115c * DAT_001f115c + DAT_001f1160 * DAT_001f1160;
      auVar42._8_4_ =
           DAT_001f115c * DAT_001f115c +
           _DAT_001f1154 * _DAT_001f1154 + fRam00000000001f1158 * fRam00000000001f1158;
      auVar42._12_4_ =
           DAT_001f1160 * DAT_001f1160 +
           fRam00000000001f1158 * fRam00000000001f1158 + DAT_001f115c * DAT_001f115c;
      auVar41 = sqrtps(auVar42,auVar42);
      _DAT_001f1344 = auVar41._0_8_;
      register0x00001208 =
           SQRT(DAT_001f1174 * DAT_001f1174 +
                DAT_001f116c * DAT_001f116c + DAT_001f1170 * DAT_001f1170);
      register0x0000120c = 0;
      _DAT_001f1354 = (pIVar15->MousePos).x;
      pvVar30 = extraout_RDX_01;
    }
    if (DAT_001f12e8 != '\x01') goto LAB_0012c046;
    fVar43 = IntersectRayPlane((vec_t *)&DAT_001f12ec,pvVar28,pvVar30);
    vVar49 = vec_t::operator*((vec_t *)&DAT_001f12ac,fVar43);
    matT.field_0.m[0][0] = vVar49.x;
    matT.field_0.m[0][1] = vVar49.y;
    matT.field_0.m[0][2] = vVar49.z;
    matT.field_0.m[0][3] = vVar49.w;
    vVar49 = vec_t::operator+((vec_t *)&DAT_001f129c,(vec_t *)&matT);
    vVar50 = vec_t::operator*((vec_t *)&DAT_001f12d8,DAT_001f12d4);
    local_6a8 = vVar49.x;
    fStack_6a4 = vVar49.y;
    local_6c8 = vVar49.z;
    fStack_6c4 = vVar49.w;
    viewInverse.field_0.m[0][1] = fStack_6a4 - vVar50.y;
    viewInverse.field_0.m[0][0] = local_6a8 - vVar50.x;
    viewInverse.field_0.m[0][2] = local_6c8 - vVar50.z;
    viewInverse.field_0.m[0][3] = fStack_6c4 - vVar50.w;
    uVar20 = DAT_001f13fc - 0xc;
    if (uVar20 < 3) {
      vVar49 = vec_t::operator-((vec_t *)&viewInverse,(vec_t *)&DAT_001f10fc);
      lVar31 = (ulong)uVar20 * 0x10;
      fVar43 = ((vec_t *)(&DAT_001f10cc + lVar31))->x;
      fVar46 = *(float *)(&DAT_001f10d0 + lVar31);
      fVar44 = *(float *)(&DAT_001f10d4 + lVar31);
      vVar49 = vec_t::operator*((vec_t *)(&DAT_001f10cc + lVar31),
                                vVar49.y * fVar46 + fVar43 * vVar49.x + vVar49.z * fVar44);
      vVar50 = vec_t::operator-((vec_t *)&DAT_001f12fc,(vec_t *)&DAT_001f10fc);
      local_678 = vVar49.x;
      fStack_674 = vVar49.y;
      local_608 = vVar49.z;
      fVar43 = ((local_608 + vVar50.z) * fVar44 +
               (fStack_674 + vVar50.y) * fVar46 + fVar43 * (local_678 + vVar50.x)) /
               (fVar44 * vVar50.z + fVar43 * vVar50.x + vVar50.y * fVar46);
      if (fVar43 <= 0.001) {
        fVar43 = 0.001;
      }
      (&DAT_001f1334)[uVar20] = fVar43;
    }
    else {
      fVar43 = ((pIVar15->MousePos).x - _DAT_001f1354) * 0.01 + 1.0;
      if (fVar43 <= 0.001) {
        fVar43 = 0.001;
      }
      _DAT_001f1334 = CONCAT44(fVar43,fVar43);
      _DAT_001f133c = CONCAT44(fVar43,fVar43);
    }
    if (snap != (float *)0x0) {
      matT.field_0.m[0][0] = *snap;
      matT.field_0.m[0][1] = matT.field_0.m[0][0];
      matT.field_0.m[0][2] = matT.field_0.m[0][0];
      ComputeSnap((vec_t *)&DAT_001f1334,(float *)&matT);
    }
    for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
      fVar43 = (&DAT_001f1334)[lVar31];
      if ((&DAT_001f1334)[lVar31] <= 0.001) {
        fVar43 = 0.001;
      }
      (&DAT_001f1334)[lVar31] = fVar43;
    }
    vVar49 = vec_t::operator*((vec_t *)&DAT_001f1334,(vec_t *)&DAT_001f1344);
    matT.field_0.m[0][0] = vVar49.x;
    matT.field_0.m[1][1] = vVar49.y;
    matT.field_0.m[0][1] = 0.0;
    matT.field_0.m[0][2] = 0.0;
    matT.field_0.m[0][3] = 0.0;
    matT.field_0.m[1][0] = 0.0;
    matT.field_0._24_8_ = 0;
    matT.field_0._32_8_ = 0;
    matT.field_0.m[2][2] = vVar49.z;
    matT.field_0.m[2][3] = 0.0;
    matT.field_0.m[3][0] = 0.0;
    matT.field_0.m[3][1] = 0.0;
    matT.field_0.m[3][2] = 0.0;
    matT.field_0.m[3][3] = 1.0;
    FPU_MatrixF_x_MatrixF((float *)&matT,(float *)&DAT_001f10cc,(float *)&matT_2);
    auVar10._4_4_ = matT_2.field_0.m[1][1];
    auVar10._0_4_ = matT_2.field_0.m[1][0];
    auVar10._8_8_ = matT_2.field_0._24_8_;
    *(ulong *)(matrix + 0xc) = CONCAT44(matT_2.field_0.m[3][1],matT_2.field_0.m[3][0]);
    *(ulong *)(matrix + 0xe) = CONCAT44(matT_2.field_0.m[3][3],matT_2.field_0.m[3][2]);
    *(undefined8 *)(matrix + 8) = matT_2.field_0._32_8_;
    *(ulong *)(matrix + 10) = CONCAT44(matT_2.field_0.m[2][3],matT_2.field_0.m[2][2]);
    *(undefined1 (*) [16])(matrix + 4) = auVar10;
    *(ulong *)matrix = CONCAT44(matT_2.field_0.m[0][1],matT_2.field_0.m[0][0]);
    *(ulong *)(matrix + 2) = CONCAT44(matT_2.field_0.m[0][3],matT_2.field_0.m[0][2]);
    if (deltaMatrix != (float *)0x0) {
      matT.field_0.m[0][0] = DAT_001f1334;
      matT.field_0.m[0][1] = 0.0;
      matT.field_0.m[0][2] = 0.0;
      matT.field_0.m[0][3] = 0.0;
      matT.field_0.m[1][0] = 0.0;
      matT.field_0.m[1][1] = DAT_001f1338;
      matT.field_0._24_8_ = 0;
      matT.field_0._32_8_ = 0;
      matT.field_0.m[2][2] = DAT_001f133c;
      matT.field_0.m[2][3] = 0.0;
      matT.field_0.m[3][0] = 0.0;
      matT.field_0.m[3][1] = 0.0;
      matT.field_0.m[3][2] = 0.0;
      matT.field_0.m[3][3] = 1.0;
      uVar27 = _DAT_001f1334 & 0xffffffff;
      auVar41 = ZEXT416((uint)DAT_001f1338);
      uVar16 = _DAT_001f133c & 0xffffffff;
      deltaMatrix[8] = 0.0;
      deltaMatrix[9] = 0.0;
      *(ulong *)(deltaMatrix + 10) = uVar16;
      *(undefined1 (*) [16])(deltaMatrix + 4) = auVar41 << 0x20;
      *(ulong *)deltaMatrix = uVar27;
      deltaMatrix[2] = 0.0;
      deltaMatrix[3] = 0.0;
      deltaMatrix[0xc] = 0.0;
      deltaMatrix[0xd] = 0.0;
      deltaMatrix[0xe] = 0.0;
      deltaMatrix[0xf] = 1.0;
    }
    cVar2 = pIVar15->MouseDown[0];
  }
  else {
    if (operation != ROTATE) goto LAB_0012c046;
    pIVar15 = ImGui::GetIO();
    bVar39 = DAT_001f1048 == LOCAL;
    type = 0;
    bVar36 = bVar39;
    if (DAT_001f12e8 == '\0') {
      type = GetRotateType();
      bVar36 = type == 0xb || bVar39;
      if ((type != 0) && (pIVar15->MouseDown[0] != false)) {
        DAT_001f12e8 = '\x01';
        matT.field_0.m[0][0] = (float)_DAT_001f10cc;
        matT.field_0.m[0][1] = (float)((ulong)_DAT_001f10cc >> 0x20);
        matT.field_0.m[0][2] = (float)_DAT_001f10d4;
        matT.field_0.m[0][3] = (float)((ulong)_DAT_001f10d4 >> 0x20);
        matT.field_0.m[1][0] = (float)_DAT_001f10dc;
        matT.field_0.m[1][1] = (float)((ulong)_DAT_001f10dc >> 0x20);
        matT.field_0._24_8_ = uRam00000000001f10e4;
        matT.field_0._32_8_ = _DAT_001f10ec;
        matT.field_0.m[2][2] = (float)uRam00000000001f10f4;
        matT.field_0.m[2][3] = (float)((ulong)uRam00000000001f10f4 >> 0x20);
        DAT_001f13fc = type;
        vVar49 = vec_t::operator-((vec_t *)&DAT_001f127c);
        matT.field_0.m[3][0] = vVar49.x;
        matT.field_0.m[3][1] = vVar49.y;
        matT.field_0.m[3][2] = vVar49.z;
        matT.field_0.m[3][3] = vVar49.w;
        if (type == 0xb || bVar39) {
          pvVar28 = matT.field_0.component + (type + -8);
          pvVar30 = (vec_t *)&DAT_001f10fc;
        }
        else {
          pvVar28 = (vec_t *)(directionUnary + (long)(type + -8) * 0x10);
          pvVar30 = (vec_t *)&DAT_001f117c;
        }
        _DAT_001f12ec = BuildPlan(pvVar30,pvVar28);
        fVar43 = IntersectRayPlane((vec_t *)&DAT_001f12ec,pvVar28,plan_02);
        vVar49 = vec_t::operator*((vec_t *)&DAT_001f12ac,fVar43);
        matT_3.field_0.m[0][0] = vVar49.x;
        matT_3.field_0.m[0][1] = vVar49.y;
        matT_3.field_0.m[0][2] = vVar49.z;
        matT_3.field_0.m[0][3] = vVar49.w;
        viewInverse.field_0.v.right = vec_t::operator+((vec_t *)&DAT_001f129c,(vec_t *)&matT_3);
        vVar49 = vec_t::operator-((vec_t *)&viewInverse,(vec_t *)&DAT_001f10fc);
        matT_2.field_0.m[0][0] = vVar49.x;
        matT_2.field_0.m[0][1] = vVar49.y;
        matT_2.field_0.m[0][2] = vVar49.z;
        matT_2.field_0.m[0][3] = vVar49.w;
        _DAT_001f131c = Normalized((vec_t *)&matT_2);
        _DAT_001f1330 = ComputeAngleOnPlan();
      }
    }
    if (DAT_001f12e8 != '\x01') goto LAB_0012c046;
    DAT_001f132c = ComputeAngleOnPlan();
    if (snap != (float *)0x0) {
      ComputeSnap(&DAT_001f132c,*snap * 0.017453292);
    }
    cumulativeDelta.x = (float)DAT_001f12ec;
    cumulativeDelta.y = DAT_001f12ec._4_4_;
    cumulativeDelta.z = DAT_001f12ec._8_4_;
    cumulativeDelta.w = 0.0;
    vec_t::TransformVector(&cumulativeDelta,(matrix_t *)&DAT_001f110c);
    vec_t::Normalize(&cumulativeDelta);
    matrix_t::RotationAxis(&matT,&cumulativeDelta,DAT_001f132c - _DAT_001f1330);
    _DAT_001f1330 = DAT_001f132c;
    matT_2.field_0.m[0][0] = DAT_001f124c;
    matT_2.field_0.m[0][1] = 0.0;
    matT_2.field_0.m[0][2] = 0.0;
    matT_2.field_0.m[0][3] = 0.0;
    matT_2.field_0.m[1][0] = 0.0;
    matT_2.field_0.m[1][1] = DAT_001f1250;
    matT_2.field_0._24_8_ = 0;
    matT_2.field_0._32_8_ = 0;
    matT_2.field_0.m[2][2] = DAT_001f1254;
    matT_2.field_0.m[2][3] = 0.0;
    matT_2.field_0.m[3][0] = 0.0;
    matT_2.field_0.m[3][1] = 0.0;
    matT_2.field_0.m[3][2] = 0.0;
    matT_2.field_0.m[3][3] = 1.0;
    if (bVar36) {
      FPU_MatrixF_x_MatrixF((float *)&matT_2,(float *)&matT,(float *)&matT_3);
      FPU_MatrixF_x_MatrixF((float *)&matT_3,(float *)&DAT_001f10cc,(float *)&viewInverse);
      auVar8._8_8_ = viewInverse.field_0._24_8_;
      auVar8._0_8_ = viewInverse.field_0._16_8_;
      *(undefined8 *)(matrix + 0xc) = viewInverse.field_0._48_8_;
      *(undefined8 *)(matrix + 0xe) = viewInverse.field_0._56_8_;
      *(undefined8 *)(matrix + 8) = viewInverse.field_0._32_8_;
      *(undefined8 *)(matrix + 10) = viewInverse.field_0._40_8_;
      *(undefined1 (*) [16])(matrix + 4) = auVar8;
      *(undefined8 *)matrix = viewInverse.field_0._0_8_;
      *(undefined8 *)(matrix + 2) = viewInverse.field_0._8_8_;
    }
    else {
      viewInverse.field_0._32_8_ = _DAT_001f116c;
      viewInverse.field_0._40_8_ = _DAT_001f1174;
      viewInverse.field_0._16_8_ = CONCAT44(DAT_001f1160,DAT_001f115c);
      viewInverse.field_0._24_8_ = _DAT_001f1164;
      viewInverse.field_0.m[0][3] = fRam00000000001f1158;
      viewInverse.field_0.m[0][2] = _DAT_001f1154;
      viewInverse.field_0._0_8_ = _DAT_001f114c;
      viewInverse.field_0._48_8_ = 0;
      viewInverse.field_0._56_8_ = 0;
      FPU_MatrixF_x_MatrixF((float *)&viewInverse,(float *)&matT,(float *)&matT_3);
      auVar7._4_4_ = matT_3.field_0.m[1][1];
      auVar7._0_4_ = matT_3.field_0.m[1][0];
      auVar7._8_4_ = matT_3.field_0.m[1][2];
      auVar7._12_4_ = matT_3.field_0.m[1][3];
      *(ulong *)(matrix + 0xc) = CONCAT44(matT_3.field_0.m[3][1],matT_3.field_0.m[3][0]);
      *(ulong *)(matrix + 0xe) = CONCAT44(matT_3.field_0.m[3][3],matT_3.field_0.m[3][2]);
      *(undefined8 *)(matrix + 8) = matT_3.field_0._32_8_;
      *(ulong *)(matrix + 10) = CONCAT44(matT_3.field_0.m[2][3],matT_3.field_0.m[2][2]);
      *(undefined1 (*) [16])(matrix + 4) = auVar7;
      *(ulong *)matrix = CONCAT44(matT_3.field_0.m[0][1],matT_3.field_0.m[0][0]);
      *(ulong *)(matrix + 2) = CONCAT44(matT_3.field_0.m[0][3],matT_3.field_0.m[0][2]);
      uVar21 = uRam00000000001f1184;
      *(undefined8 *)(matrix + 0xc) = _DAT_001f117c;
      *(undefined8 *)(matrix + 0xe) = uVar21;
    }
    if (deltaMatrix != (float *)0x0) {
      FPU_MatrixF_x_MatrixF((float *)&DAT_001f110c,(float *)&matT,(float *)&matT_3);
      FPU_MatrixF_x_MatrixF((float *)&matT_3,(float *)&DAT_001f10cc,(float *)&viewInverse);
      auVar9._8_8_ = viewInverse.field_0._24_8_;
      auVar9._0_8_ = viewInverse.field_0._16_8_;
      *(undefined8 *)(deltaMatrix + 0xc) = viewInverse.field_0._48_8_;
      *(undefined8 *)(deltaMatrix + 0xe) = viewInverse.field_0._56_8_;
      *(undefined8 *)(deltaMatrix + 8) = viewInverse.field_0._32_8_;
      *(undefined8 *)(deltaMatrix + 10) = viewInverse.field_0._40_8_;
      *(undefined1 (*) [16])(deltaMatrix + 4) = auVar9;
      *(undefined8 *)deltaMatrix = viewInverse.field_0._0_8_;
      *(undefined8 *)(deltaMatrix + 2) = viewInverse.field_0._8_8_;
    }
    cVar2 = pIVar15->MouseDown[0];
  }
  type = DAT_001f13fc;
  if (cVar2 == '\0') {
    DAT_001f12e8 = '\0';
  }
LAB_0012c046:
  if ((localBounds != (float *)0x0) && (DAT_001f12e8 == '\0')) {
    pIVar15 = ImGui::GetIO();
    pIVar12 = gContext;
    local_668 = (ulong)DAT_001f13ac;
    uVar20 = DAT_001f13ac;
    if (DAT_001f13b8 == 0) {
      fVar43 = 0.0;
      puVar34 = directionUnary;
      for (uVar27 = 0; uVar20 = (uint)local_668, uVar27 != 3; uVar27 = uVar27 + 1) {
        matT.field_0.m[0][0] = (float)*(undefined8 *)puVar34;
        matT.field_0.m[0][1] = (float)((ulong)*(undefined8 *)puVar34 >> 0x20);
        matT.field_0.m[0][2] = (float)*(undefined8 *)((long)puVar34 + 8);
        matT.field_0.m[0][3] = (float)((ulong)*(undefined8 *)((long)puVar34 + 8) >> 0x20);
        vec_t::TransformVector((vec_t *)&matT,(matrix_t *)&DAT_001f114c);
        vec_t::Normalize((vec_t *)&matT);
        vVar49 = vec_t::operator-((vec_t *)&DAT_001f125c,(vec_t *)&DAT_001f117c);
        matT_2.field_0.m[0][0] = vVar49.x;
        matT_2.field_0.m[0][1] = vVar49.y;
        matT_2.field_0.m[0][2] = vVar49.z;
        matT_2.field_0.m[0][3] = vVar49.w;
        vVar49 = Normalized((vec_t *)&matT_2);
        fVar46 = ABS(vVar49.z * matT.field_0.m[0][2] +
                     matT.field_0.m[0][0] * vVar49.x + vVar49.y * matT.field_0.m[0][1]);
        if (fVar43 <= fVar46) {
          bestAxisWorldDirection.y = matT.field_0.m[0][1];
          bestAxisWorldDirection.x = matT.field_0.m[0][0];
          bestAxisWorldDirection.w = matT.field_0.m[0][3];
          bestAxisWorldDirection.z = matT.field_0.m[0][2];
          local_668 = uVar27 & 0xffffffff;
          fVar43 = fVar46;
        }
        puVar34 = (undefined1 *)((long)puVar34 + 0x10);
      }
    }
    local_668._0_4_ = uVar20;
    iVar29 = (int)((uint)local_668 + 1) % 3;
    iVar23 = (int)((uint)local_668 + 2) % 3;
    lVar31 = (long)iVar29;
    pIVar32 = (ImGuiIO *)(long)iVar23;
    for (pIVar22 = (ImGuiIO *)0x0; pIVar22 != (ImGuiIO *)0x4;
        pIVar22 = (ImGuiIO *)((long)&(pIVar22->DisplaySize).x + 1)) {
      (&pvVar24->x)[(int)(uint)local_668] = 0.0;
      pvVar24->w = 0.0;
      uVar20 = (uint)((ulong)pIVar22 >> 1) & 0x7fffffff;
      (&pvVar24->x)[lVar31] = localBounds[(int)(uVar20 * 3 + iVar29)];
      (&pvVar24->x)[(long)pIVar32] = localBounds[(int)(((uint)pIVar22 & 1 ^ uVar20) * 3 + iVar23)];
      pvVar24 = pvVar24 + 1;
    }
    rVector = (ImGuiIO *)&DAT_001f120c;
    pIVar38 = (ImGuiIO *)0x80aaaaaa;
    if (DAT_001f12e9 != 0) {
      pIVar38 = (ImGuiIO *)0xffaaaaaa;
    }
    IVar37 = (ImU32)pIVar38;
    FPU_MatrixF_x_MatrixF((float *)&DAT_001f114c,(float *)&DAT_001f120c,(float *)&viewInverse);
    pvVar24 = extraout_RDX_02;
    lVar35 = 0;
    while( true ) {
      centre = (ImGuiIO *)&cumulativeDelta;
      if (lVar35 == 4) break;
      pvVar28 = matT_2.field_0.component + lVar35;
      IVar40 = worldToPos(pvVar28,&viewInverse);
      matT_3.field_0.m[0][0] = IVar40.x;
      matT_3.field_0.m[0][1] = IVar40.y;
      lVar1 = lVar35 + 1;
      pvVar24 = (vec_t *)((long)&matT_2.field_0 + (ulong)(((uint)lVar1 & 3) << 4));
      IVar40 = worldToPos(pvVar24,&viewInverse);
      fVar43 = matT_3.field_0.m[0][0] - IVar40.x;
      fVar46 = matT_3.field_0.m[0][1] - IVar40.y;
      fVar43 = SQRT(fVar43 * fVar43 + fVar46 * fVar46) / 10.0;
      iVar33 = (int)fVar43;
      fVar43 = 1.0 / (float)(int)fVar43;
      iVar25 = 0;
      if (iVar33 < 1) {
        iVar33 = 0;
        iVar25 = 0;
      }
      for (; uVar19 = SUB84(pIVar22,0), iVar33 != iVar25; iVar25 = iVar25 + 1) {
        fVar46 = (float)iVar25 * fVar43;
        fVar44 = fVar46 + fVar43 * 0.5;
        fVar47 = IVar40.x - matT_3.field_0.m[0][0];
        fVar48 = IVar40.y - matT_3.field_0.m[0][1];
        matT.field_0.m[0][0] = fVar46 * fVar47 + matT_3.field_0.m[0][0];
        matT.field_0.m[0][1] = fVar46 * fVar48 + matT_3.field_0.m[0][1];
        cumulativeDelta.x = fVar44 * fVar47 + matT_3.field_0.m[0][0];
        cumulativeDelta.y = fVar44 * fVar48 + matT_3.field_0.m[0][1];
        pIVar22 = pIVar38;
        ImDrawList::AddLine(pIVar12,(ImVec2 *)&matT,(ImVec2 *)centre,IVar37,3.0);
      }
      vVar49 = vec_t::operator+(pvVar28,pvVar24);
      matT.field_0.m[0][0] = vVar49.x * 0.5;
      matT.field_0.m[0][1] = vVar49.y * 0.5;
      matT.field_0.m[0][2] = vVar49.z * 0.5;
      matT.field_0.m[0][3] = vVar49.w * 0.5;
      IVar40 = worldToPos((vec_t *)&matT,&viewInverse);
      cumulativeDelta.x = IVar40.x;
      cumulativeDelta.y = IVar40.y;
      fVar43 = (pIVar15->MousePos).x;
      fVar46 = (pIVar15->MousePos).y;
      fVar44 = cumulativeDelta.x - fVar43;
      fVar43 = matT_3.field_0.m[0][0] - fVar43;
      fVar47 = cumulativeDelta.y - fVar46;
      fVar46 = matT_3.field_0.m[0][1] - fVar46;
      iVar25 = -(uint)(fVar44 * fVar44 + fVar47 * fVar47 <= 64.0);
      iVar33 = -(uint)(fVar43 * fVar43 + fVar46 * fVar46 <= 64.0);
      auVar3._4_4_ = iVar25;
      auVar3._0_4_ = iVar25;
      auVar3._8_4_ = iVar33;
      auVar3._12_4_ = iVar33;
      uVar20 = movmskpd(uVar19,auVar3);
      bVar18 = (byte)uVar20;
      col = IVar37;
      if (bVar18 >> 1 != 0) {
        col = 0xff1080ff;
      }
      col_00 = IVar37;
      if ((uVar20 & 1) != 0) {
        col_00 = 0xff1080ff;
      }
      ImDrawList::AddCircleFilled(pIVar12,(ImVec2 *)&matT_3,8.0,col,0xc);
      uVar21 = 0;
      ImDrawList::AddCircleFilled(pIVar12,(ImVec2 *)centre,6.0,col_00,0xc);
      uVar20 = (uint)lVar35;
      pvVar24 = (vec_t *)CONCAT71((int7)((ulong)extraout_RDX_03 >> 8),DAT_001f12e9);
      uVar27 = (ulong)(uVar20 ^ 2);
      rVector = centre;
      if ((((DAT_001f13b8 == 0) && (bVar18 >> 1 != 0)) && ((DAT_001f12e9 & 1) != 0)) &&
         (rVector = pIVar15, pIVar15->MouseDown[0] == true)) {
        pafVar26 = matT_2.field_0.m + uVar27;
        _DAT_001f136c = *(undefined8 *)*pafVar26;
        uRam00000000001f1374 = *(undefined8 *)((long)&matT_2.field_0 + uVar27 * 0x10 + 8);
        vec_t::TransformPoint((vec_t *)&DAT_001f136c,(matrix_t *)&DAT_001f114c);
        _DAT_001f137c = pvVar28->x;
        unique0x10002ff7 = pvVar28->y;
        uRam00000000001f1384 = *(undefined8 *)((long)&matT_2.field_0 + lVar35 * 0x10 + 8);
        vec_t::TransformPoint((vec_t *)&DAT_001f137c,(matrix_t *)&DAT_001f114c);
        rVector = (ImGuiIO *)&bestAxisWorldDirection;
        _DAT_001f138c = BuildPlan((vec_t *)&DAT_001f137c,(vec_t *)rVector);
        DAT_001f139c = 0;
        _DAT_001f13a4 = 0;
        DAT_001f13ac = (uint)local_668;
        DAT_001f13b0 = iVar29;
        DAT_001f13b4 = iVar23;
        *(float *)((long)&DAT_001f139c + lVar31 * 4) = (*pafVar26)[lVar31];
        *(float *)((long)&DAT_001f139c + (long)pIVar32 * 4) = (*pafVar26)[(long)pIVar32];
        DAT_001f13b8 = 1;
        _DAT_001f13c4 = CONCAT44(fRam00000000001f1158,_DAT_001f1154);
        _DAT_001f13bc = _DAT_001f114c;
        _DAT_001f13cc = CONCAT44(DAT_001f1160,DAT_001f115c);
        _DAT_001f13d4 = _DAT_001f1164;
        _DAT_001f13dc = _DAT_001f116c;
        _DAT_001f13e4 = _DAT_001f1174;
        _DAT_001f13ec = _DAT_001f117c;
        uRam00000000001f13f4 = uRam00000000001f1184;
        pIVar22 = pIVar32;
        pvVar24 = extraout_RDX_04;
        lVar35 = lVar1;
      }
      else {
        bVar18 = (DAT_001f13b8 ^ 1) & DAT_001f12e9 & bVar18;
        pIVar22 = (ImGuiIO *)CONCAT71((int7)((ulong)uVar21 >> 8),bVar18);
        lVar35 = lVar1;
        if ((bVar18 == 1) && (pIVar22 = pIVar15, pIVar15->MouseDown[0] == true)) {
          vVar49 = vec_t::operator+(matT_2.field_0.component + uVar27,
                                    (vec_t *)((long)&matT_2.field_0 + (ulong)((uVar20 - 1 & 3) << 4)
                                             ));
          _DAT_001f136c = CONCAT44(vVar49.y * 0.5,vVar49.x * 0.5);
          uRam00000000001f1374 = CONCAT44(vVar49.w * 0.5,vVar49.z * 0.5);
          vec_t::TransformPoint((vec_t *)&DAT_001f136c,(matrix_t *)&DAT_001f114c);
          _DAT_001f137c = CONCAT44(matT.field_0.m[0][1],matT.field_0.m[0][0]);
          uRam00000000001f1384 = CONCAT44(matT.field_0.m[0][3],matT.field_0.m[0][2]);
          vec_t::TransformPoint((vec_t *)&DAT_001f137c,(matrix_t *)&DAT_001f114c);
          rVector = (ImGuiIO *)&bestAxisWorldDirection;
          _DAT_001f138c = BuildPlan((vec_t *)&DAT_001f137c,(vec_t *)rVector);
          indices[0] = iVar29;
          indices[1] = iVar23;
          DAT_001f13b0 = indices[uVar20 & 1];
          DAT_001f13b4 = -1;
          DAT_001f139c = 0;
          _DAT_001f13a4 = 0;
          pIVar22 = (ImGuiIO *)&gContext;
          DAT_001f13ac = (uint)local_668;
          *(float *)((long)&DAT_001f139c + (long)DAT_001f13b0 * 4) =
               (&matT_2.field_0.component[uVar27].x)[DAT_001f13b0];
          DAT_001f13b8 = 1;
          _DAT_001f13c4 = CONCAT44(fRam00000000001f1158,_DAT_001f1154);
          _DAT_001f13bc = _DAT_001f114c;
          _DAT_001f13cc = CONCAT44(DAT_001f1160,DAT_001f115c);
          _DAT_001f13d4 = _DAT_001f1164;
          _DAT_001f13dc = _DAT_001f116c;
          _DAT_001f13e4 = _DAT_001f1174;
          _DAT_001f13ec = _DAT_001f117c;
          uRam00000000001f13f4 = uRam00000000001f1184;
          pvVar24 = extraout_RDX_05;
        }
      }
    }
    if (DAT_001f13b8 != 0) {
      matT_3.field_0.m[0][0] = 1.0;
      matT_3.field_0.m[0][1] = 0.0;
      matT_3.field_0.m[0][2] = 0.0;
      matT_3.field_0.m[0][3] = 0.0;
      matT_3.field_0.m[1][0] = 0.0;
      matT_3.field_0.m[1][1] = 1.0;
      matT_3.field_0.m[1][2] = 0.0;
      matT_3.field_0.m[1][3] = 0.0;
      matT_3.field_0._32_8_ = 0;
      matT_3.field_0.m[2][2] = 1.0;
      matT_3.field_0.m[2][3] = 0.0;
      matT_3.field_0.m[3][0] = 0.0;
      matT_3.field_0.m[3][1] = 0.0;
      matT_3.field_0.m[3][2] = 0.0;
      matT_3.field_0.m[3][3] = 1.0;
      fVar43 = IntersectRayPlane((vec_t *)&DAT_001f138c,(vec_t *)rVector,pvVar24);
      vVar49 = vec_t::operator*((vec_t *)&DAT_001f12ac,fVar43);
      matT.field_0.m[0][0] = vVar49.x;
      matT.field_0.m[0][1] = vVar49.y;
      matT.field_0.m[0][2] = vVar49.z;
      matT.field_0.m[0][3] = vVar49.w;
      newPos = vec_t::operator+((vec_t *)&DAT_001f129c,(vec_t *)&matT);
      vVar49 = vec_t::operator-(&newPos,(vec_t *)&DAT_001f136c);
      local_558 = ABS(vVar49.x);
      local_678 = ABS(vVar49.y);
      local_548 = ABS(vVar49.z);
      vVar49 = vec_t::operator-((vec_t *)&DAT_001f137c,(vec_t *)&DAT_001f136c);
      local_618 = ABS(vVar49.x);
      local_6a8 = ABS(vVar49.y);
      local_608 = ABS(vVar49.z);
      for (lVar31 = 0; lVar31 != 2; lVar31 = lVar31 + 1) {
        lVar35 = (long)(&DAT_001f13b0)[lVar31];
        if (lVar35 != -1) {
          vVar49 = vec_t::Abs((vec_t *)(&DAT_001f13bc + lVar35 * 4));
          fVar46 = vVar49.w * 0.0 +
                   vVar49.z * local_608 + vVar49.x * local_618 + local_6a8 * vVar49.y;
          fVar43 = 1.0;
          if (1.1920929e-07 < fVar46) {
            fVar43 = (vVar49.w * 0.0 +
                     vVar49.z * local_548 + vVar49.x * local_558 + vVar49.y * local_678) / fVar46;
          }
          if (boundsSnap != (float *)0x0) {
            fVar46 = localBounds[lVar35 + 3] - localBounds[lVar35];
            matT.field_0.m[0][0] = fVar46 * fVar43;
            ComputeSnap((float *)&matT,boundsSnap[lVar35]);
            fVar43 = (float)(~-(uint)(1.1920929e-07 < fVar46) & (uint)fVar43 |
                            (uint)(matT.field_0.m[0][0] / fVar46) & -(uint)(1.1920929e-07 < fVar46))
            ;
          }
          vec_t::operator*=(matT_3.field_0.component + lVar35,fVar43);
        }
      }
      vec_t::operator-((vec_t *)&DAT_001f139c);
      cumulativeDelta.x = 1.0;
      cumulativeDelta.y = 0.0;
      cumulativeDelta.z = 0.0;
      cumulativeDelta.w = 0.0;
      indices[0] = 0x3f800000;
      indices[1] = 0;
      FPU_MatrixF_x_MatrixF(&cumulativeDelta.x,(float *)&matT_3,(float *)&matT_11);
      FPU_MatrixF_x_MatrixF((float *)&matT_11,(float *)indices,(float *)&matT);
      FPU_MatrixF_x_MatrixF((float *)&matT,&DAT_001f13bc,(float *)&res_1);
      *(undefined8 *)(matrix + 0xc) = res_1.field_0._48_8_;
      *(undefined8 *)(matrix + 0xe) = res_1.field_0._56_8_;
      *(undefined8 *)(matrix + 8) = res_1.field_0._32_8_;
      *(undefined8 *)(matrix + 10) = res_1.field_0._40_8_;
      *(undefined8 *)(matrix + 4) = res_1.field_0._16_8_;
      *(undefined8 *)(matrix + 6) = res_1.field_0._24_8_;
      *(undefined8 *)matrix = res_1.field_0._0_8_;
      *(undefined8 *)(matrix + 2) = res_1.field_0._8_8_;
      IVar40 = worldToPos((vec_t *)&DAT_001f10fc,(matrix_t *)&DAT_001f120c);
      ImFormatString((char *)&matT,0x200,"X: %.2f Y: %.2f Z:%.2f",
                     (double)(SQRT(matT_3.field_0.m[0][2] * matT_3.field_0.m[0][2] +
                                   matT_3.field_0.m[0][0] * matT_3.field_0.m[0][0] +
                                   matT_3.field_0.m[0][1] * matT_3.field_0.m[0][1]) *
                             SQRT(DAT_001f13c4 * DAT_001f13c4 +
                                  DAT_001f13bc * DAT_001f13bc + DAT_001f13c0 * DAT_001f13c0) *
                             (localBounds[3] - *localBounds)),
                     (double)(SQRT(matT_3.field_0.m[1][2] * matT_3.field_0.m[1][2] +
                                   matT_3.field_0.m[1][0] * matT_3.field_0.m[1][0] +
                                   matT_3.field_0.m[1][1] * matT_3.field_0.m[1][1]) *
                             SQRT(DAT_001f13d4 * DAT_001f13d4 +
                                  DAT_001f13cc * DAT_001f13cc + DAT_001f13d0 * DAT_001f13d0) *
                             (localBounds[4] - localBounds[1])),
                     SUB84((double)(SQRT(matT_3.field_0.m[2][2] * matT_3.field_0.m[2][2] +
                                         matT_3.field_0.m[2][0] * matT_3.field_0.m[2][0] +
                                         matT_3.field_0.m[2][1] * matT_3.field_0.m[2][1]) *
                                   SQRT(DAT_001f13e4 * DAT_001f13e4 +
                                        DAT_001f13dc * DAT_001f13dc + DAT_001f13e0 * DAT_001f13e0) *
                                   (localBounds[5] - localBounds[2])),0));
      local_6d8 = IVar40.x;
      fStack_6d4 = IVar40.y;
      matT_11.field_0._0_8_ = CONCAT44(fStack_6d4 + 15.0,local_6d8 + 15.0);
      ImDrawList::AddText(pIVar12,(ImVec2 *)&matT_11,0xff000000,(char *)&matT,(char *)0x0);
      matT_11.field_0._0_8_ = CONCAT44(fStack_6d4 + 14.0,local_6d8 + 14.0);
      ImDrawList::AddText(pIVar12,(ImVec2 *)&matT_11,0xffffffff,(char *)&matT,(char *)0x0);
    }
    if (pIVar15->MouseDown[0] == false) {
      DAT_001f13b8 = 0;
    }
  }
  pIVar12 = gContext;
  if (DAT_001f13b8 != 0) {
    return;
  }
  if (operation == TRANSLATE) {
    if (gContext == (ImDrawList *)0x0) {
      return;
    }
    ComputeColors((ImU32 *)&matT_2,type,TRANSLATE);
    ImDrawList::AddRectFilled
              (pIVar12,(ImVec2 *)&DAT_001f12c4,(ImVec2 *)&DAT_001f12cc,(ImU32)matT_2.field_0.m[0][0]
               ,2.0,-1);
    for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
      ComputeTripodAxisAndVisibility
                ((int)lVar31,(vec_t *)&viewInverse,(vec_t *)&matT_3,(bool *)&res_1,(bool *)&matT_11)
      ;
      if (res_1.field_0._0_1_ == '\x01') {
        matT.field_0.m[0][0] = viewInverse.field_0.m[0][0] * 0.1 * DAT_001f12d4;
        matT.field_0.m[0][1] = viewInverse.field_0.m[0][1] * 0.1 * DAT_001f12d4;
        matT.field_0.m[0][2] = viewInverse.field_0.m[0][2] * 0.1 * DAT_001f12d4;
        matT.field_0.m[0][3] = viewInverse.field_0.m[0][3] * 0.1 * DAT_001f12d4;
        IVar40 = worldToPos((vec_t *)&matT,(matrix_t *)&DAT_001f11cc);
        cumulativeDelta.x = IVar40.x;
        cumulativeDelta.y = IVar40.y;
        matT.field_0.m[0][0] = viewInverse.field_0.m[0][0] * DAT_001f12d4;
        matT.field_0.m[0][1] = viewInverse.field_0.m[0][1] * DAT_001f12d4;
        matT.field_0.m[0][2] = viewInverse.field_0.m[0][2] * DAT_001f12d4;
        matT.field_0.m[0][3] = viewInverse.field_0.m[0][3] * DAT_001f12d4;
        IVar40 = worldToPos((vec_t *)&matT,(matrix_t *)&DAT_001f11cc);
        indices[0] = (int)IVar40.x;
        indices[1] = (int)IVar40.y;
        ImDrawList::AddLine(pIVar12,(ImVec2 *)&cumulativeDelta,(ImVec2 *)indices,
                            *(ImU32 *)((long)&matT_2.field_0 + lVar31 * 4 + 4),6.0);
        if ((float)(&DAT_001f1360)[lVar31] <= 0.0 && (float)(&DAT_001f1360)[lVar31] != 0.0) {
          DrawHatchedAxis((vec_t *)&viewInverse);
        }
      }
      if (matT_11.field_0._0_1_ == '\x01') {
        matT.field_0.m[1][0] = 0.0;
        matT.field_0.m[1][1] = 0.0;
        matT.field_0._24_8_ = 0;
        matT.field_0.m[0][0] = 0.0;
        matT.field_0.m[0][1] = 0.0;
        matT.field_0.m[0][2] = 0.0;
        matT.field_0.m[0][3] = 0.0;
        for (lVar35 = 0; lVar35 != 4; lVar35 = lVar35 + 1) {
          fVar43 = (float)(&quadUV)[lVar35 * 2];
          fVar46 = (float)(&DAT_00192bb4)[lVar35 * 2];
          cumulativeDelta.x =
               (matT_3.field_0.m[0][0] * fVar46 + viewInverse.field_0.m[0][0] * fVar43) *
               DAT_001f12d4;
          cumulativeDelta.y =
               (matT_3.field_0.m[0][1] * fVar46 + viewInverse.field_0.m[0][1] * fVar43) *
               DAT_001f12d4;
          cumulativeDelta.z =
               (matT_3.field_0.m[0][2] * fVar46 + viewInverse.field_0.m[0][2] * fVar43) *
               DAT_001f12d4;
          cumulativeDelta.w =
               (matT_3.field_0.m[0][3] * fVar46 + viewInverse.field_0.m[0][3] * fVar43) *
               DAT_001f12d4;
          IVar40 = worldToPos(&cumulativeDelta,(matrix_t *)&DAT_001f11cc);
          *(ImVec2 *)((long)&matT.field_0 + lVar35 * 8) = IVar40;
        }
        ImDrawList::AddConvexPolyFilled
                  (pIVar12,(ImVec2 *)&matT,4,*(ImU32 *)((long)&matT_2.field_0 + lVar31 * 4 + 0x10),
                   true);
      }
    }
    if (DAT_001f12e8 == '\0') {
      return;
    }
    IVar40 = worldToPos((vec_t *)&DAT_001f130c,(matrix_t *)&DAT_001f120c);
    cumulativeDelta.x = IVar40.x;
    fVar43 = cumulativeDelta.x;
    cumulativeDelta.y = IVar40.y;
    fVar46 = cumulativeDelta.y;
    IVar40 = worldToPos((vec_t *)&DAT_001f10fc,(matrix_t *)&DAT_001f120c);
    indices[0] = (int)IVar40.x;
    indices[1] = (int)IVar40.y;
    viewInverse.field_0.m[0][1] = (float)indices[1] - fVar46;
    viewInverse.field_0.m[0][0] = (float)indices[0] - fVar43;
    viewInverse.field_0._8_8_ = 0;
    vec_t::Normalize((vec_t *)&viewInverse);
    viewInverse.field_0.m[0][1] = viewInverse.field_0.m[0][1] * 5.0;
    viewInverse.field_0.m[0][0] = viewInverse.field_0.m[0][0] * 5.0;
    viewInverse.field_0.m[0][2] = viewInverse.field_0.m[0][2] * 5.0;
    viewInverse.field_0.m[0][3] = viewInverse.field_0.m[0][3] * 5.0;
    ImDrawList::AddCircle(pIVar12,(ImVec2 *)&cumulativeDelta,6.0,0xaaaaaaaa,0xc,1.0);
    ImDrawList::AddCircle(pIVar12,(ImVec2 *)indices,6.0,0xaaaaaaaa,0xc,1.0);
    matT.field_0.m[0][0] = cumulativeDelta.x + viewInverse.field_0.m[0][0];
    matT.field_0.m[0][1] = cumulativeDelta.y + viewInverse.field_0.m[0][1];
    matT_3.field_0.m[0][0] = (float)indices[0] - viewInverse.field_0.m[0][0];
    matT_3.field_0.m[0][1] = (float)indices[1] - viewInverse.field_0.m[0][1];
    ImDrawList::AddLine(pIVar12,(ImVec2 *)&matT,(ImVec2 *)&matT_3,0xaaaaaaaa,2.0);
    vVar49 = vec_t::operator-((vec_t *)&DAT_001f10fc,(vec_t *)&DAT_001f130c);
    matT_3.field_0.m[0][0] = vVar49.x;
    matT_3.field_0.m[0][1] = vVar49.y;
    matT_3.field_0.m[0][2] = vVar49.z;
    matT_3.field_0.m[0][3] = vVar49.w;
    lVar31 = (long)(type * 3 + -3);
    buf = &matT;
    ImFormatString((char *)buf,0x200,
                   _ZN8ImGuizmoL19translationInfoMaskE_rel +
                   *(int *)(_ZN8ImGuizmoL16rotationInfoMaskE_rel + (long)type * 4 + 0xc),
                   (double)matT_3.field_0.m16[*(int *)(translationInfoIndex + lVar31 * 4)],
                   (double)matT_3.field_0.m16[*(int *)(translationInfoIndex + lVar31 * 4 + 4)],
                   SUB84((double)matT_3.field_0.m16[*(int *)(translationInfoIndex + lVar31 * 4 + 8)]
                         ,0));
    res_1.field_0._0_8_ = CONCAT44((float)indices[1] + 15.0,(float)indices[0] + 15.0);
    ImDrawList::AddText(pIVar12,(ImVec2 *)&res_1,0xff000000,(char *)buf,(char *)0x0);
    res_1.field_0._0_8_ = CONCAT44((float)indices[1] + 14.0,(float)indices[0] + 14.0);
    pvVar24 = (vec_t *)&res_1;
  }
  else {
    if (operation == SCALE) {
      ComputeColors((ImU32 *)&matT_2,type,SCALE);
      ImDrawList::AddCircleFilled
                (pIVar12,(ImVec2 *)&DAT_001f12bc,12.0,(ImU32)matT_2.field_0.m[0][0],0x20);
      viewInverse.field_0._8_8_ = 0x3f8000003f800000;
      viewInverse.field_0._0_8_ = 0x3f8000003f800000;
      if (DAT_001f12e8 == '\x01') {
        viewInverse.field_0._8_8_ = _DAT_001f133c;
        viewInverse.field_0._0_8_ = _DAT_001f1334;
      }
      lVar31 = 0;
      do {
        while( true ) {
          if (lVar31 == 3) {
            if (DAT_001f12e8 == '\0') {
              return;
            }
            IVar40 = worldToPos((vec_t *)&DAT_001f10fc,(matrix_t *)&DAT_001f120c);
            buf = &matT;
            ImFormatString((char *)buf,0x200,
                           _ZN8ImGuizmoL13scaleInfoMaskE_rel +
                           *(int *)(translationInfoIndex + (long)type * 4 + 0x24),
                           (double)viewInverse.field_0.m16
                                   [*(int *)(translationInfoIndex + (long)(type * 3 + -0x24) * 4)]);
            local_6c8 = IVar40.x;
            fStack_6c4 = IVar40.y;
            matT_3.field_0.m[0][0] = local_6c8 + 15.0;
            matT_3.field_0.m[0][1] = fStack_6c4 + 15.0;
            ImDrawList::AddText(pIVar12,(ImVec2 *)&matT_3,0xff000000,(char *)buf,(char *)0x0);
            matT_3.field_0.m[0][0] = local_6c8 + 14.0;
            matT_3.field_0.m[0][1] = fStack_6c4 + 14.0;
            pvVar24 = (vec_t *)&matT_3;
            goto LAB_0012d8a6;
          }
          ComputeTripodAxisAndVisibility
                    ((int)lVar31,(vec_t *)&matT,(vec_t *)&matT_3,(bool *)&bestAxisWorldDirection,
                     (bool *)&newPos);
          if (bestAxisWorldDirection.x._0_1_ != '\0') break;
          lVar31 = lVar31 + 1;
        }
        cumulativeDelta.x = matT.field_0.m[0][0] * 0.1 * DAT_001f12d4;
        cumulativeDelta.y = matT.field_0.m[0][1] * 0.1 * DAT_001f12d4;
        cumulativeDelta.z = matT.field_0.m[0][2] * 0.1 * DAT_001f12d4;
        cumulativeDelta.w = matT.field_0.m[0][3] * 0.1 * DAT_001f12d4;
        IVar40 = worldToPos(&cumulativeDelta,(matrix_t *)&DAT_001f11cc);
        indices[0] = (int)IVar40.x;
        indices[1] = (int)IVar40.y;
        cumulativeDelta.x = matT.field_0.m[0][0] * DAT_001f12d4;
        cumulativeDelta.y = matT.field_0.m[0][1] * DAT_001f12d4;
        cumulativeDelta.z = matT.field_0.m[0][2] * DAT_001f12d4;
        cumulativeDelta.w = matT.field_0.m[0][3] * DAT_001f12d4;
        IVar40 = worldToPos(&cumulativeDelta,(matrix_t *)&DAT_001f11cc);
        res_1.field_0._0_4_ = IVar40.x;
        res_1.field_0._4_4_ = IVar40.y;
        fVar43 = viewInverse.field_0.m16[lVar31];
        cumulativeDelta.x = matT.field_0.m[0][0] * fVar43 * DAT_001f12d4;
        cumulativeDelta.y = matT.field_0.m[0][1] * fVar43 * DAT_001f12d4;
        cumulativeDelta.z = matT.field_0.m[0][2] * fVar43 * DAT_001f12d4;
        cumulativeDelta.w = matT.field_0.m[0][3] * fVar43 * DAT_001f12d4;
        IVar40 = worldToPos(&cumulativeDelta,(matrix_t *)&DAT_001f11cc);
        matT_11.field_0._0_4_ = IVar40.x;
        matT_11.field_0._4_4_ = IVar40.y;
        if (DAT_001f12e8 == '\x01') {
          ImDrawList::AddLine(pIVar12,(ImVec2 *)indices,(ImVec2 *)&res_1,0xff404040,6.0);
          ImDrawList::AddCircleFilled(pIVar12,(ImVec2 *)&res_1,10.0,0xff404040,0xc);
        }
        IVar37 = *(ImU32 *)((long)&matT_2.field_0 + lVar31 * 4 + 4);
        ImDrawList::AddLine(pIVar12,(ImVec2 *)indices,(ImVec2 *)&matT_11,IVar37,6.0);
        ImDrawList::AddCircleFilled(pIVar12,(ImVec2 *)&matT_11,10.0,IVar37,0xc);
        if ((float)(&DAT_001f1360)[lVar31] <= 0.0 && (float)(&DAT_001f1360)[lVar31] != 0.0) {
          cumulativeDelta.x = matT.field_0.m[0][0] * fVar43;
          cumulativeDelta.y = matT.field_0.m[0][1] * fVar43;
          cumulativeDelta.z = matT.field_0.m[0][2] * fVar43;
          cumulativeDelta.w = matT.field_0.m[0][3] * fVar43;
          DrawHatchedAxis(&cumulativeDelta);
        }
        lVar31 = lVar31 + 1;
      } while( true );
    }
    if (operation != ROTATE) {
      return;
    }
    ImGui::GetIO();
    ComputeColors((ImU32 *)&viewInverse,type,ROTATE);
    vVar49 = vec_t::operator-((vec_t *)&DAT_001f10fc,(vec_t *)&DAT_001f125c);
    matT.field_0.m[0][0] = vVar49.x;
    matT.field_0.m[0][1] = vVar49.y;
    matT.field_0.m[0][2] = vVar49.z;
    matT.field_0.m[0][3] = vVar49.w;
    vVar49 = Normalized((vec_t *)&matT);
    matT_3.field_0.m[0][0] = vVar49.x;
    matT_3.field_0.m[0][1] = vVar49.y;
    matT_3.field_0.m[0][2] = vVar49.z;
    matT_3.field_0.m[0][3] = vVar49.w;
    vec_t::TransformVector((vec_t *)&matT_3,(matrix_t *)&DAT_001f110c);
    uVar27 = 0;
    while (uVar27 != 3) {
      memset(&matT,0,0x200);
      uVar16 = (ulong)(1 - (int)uVar27);
      if (uVar27 == 2) {
        uVar16 = 2;
      }
      uVar17 = 3 - uVar27 & 0xffffffff;
      if (uVar27 == 0) {
        uVar17 = 0;
      }
      fVar43 = atan2f(matT_3.field_0.m16[uVar16],matT_3.field_0.m16[uVar17]);
      for (lVar31 = 0; lVar31 != 0x40; lVar31 = lVar31 + 1) {
        fVar46 = (float)(int)lVar31 * 0.015625 * 3.1415927 + fVar43 + 1.5707964;
        fVar44 = cosf(fVar46);
        matT_2.field_0.m[0][1] = sinf(fVar46);
        matT_2.field_0.m[0][0] = fVar44;
        matT_2.field_0.m[0][2] = 0.0;
        matT_2.field_0.m[0][3] = 0.0;
        cumulativeDelta.x = matT_2.field_0.m16[uVar27] * DAT_001f12d4;
        cumulativeDelta.y = matT_2.field_0.m16[(uVar27 + 1 & 0xffffffff) % 3] * DAT_001f12d4;
        cumulativeDelta.z = matT_2.field_0.m16[(ulong)((int)uVar27 + 2) % 3] * DAT_001f12d4;
        cumulativeDelta.w = DAT_001f12d4 * 0.0;
        IVar40 = worldToPos(&cumulativeDelta,(matrix_t *)&DAT_001f11cc);
        *(ImVec2 *)((long)&matT.field_0 + lVar31 * 8) = IVar40;
      }
      ImDrawList::AddPolyline
                (pIVar12,(ImVec2 *)&matT,0x40,*(ImU32 *)((long)&viewInverse + (3 - uVar27) * 4),
                 false,2.0,true);
      uVar27 = uVar27 + 1;
    }
    IVar40 = worldToPos((vec_t *)&DAT_001f10fc,(matrix_t *)&DAT_001f120c);
    matT.field_0.m[0][0] = IVar40.x;
    matT.field_0.m[0][1] = IVar40.y;
    ImDrawList::AddCircle
              (pIVar12,(ImVec2 *)&matT,DAT_001f1408._4_4_ * 0.06,(ImU32)viewInverse.field_0.m[0][0],
               0x40,1.0);
    if (DAT_001f12e8 == '\0') {
      return;
    }
    memset(&matT,0,0x208);
    IVar40 = worldToPos((vec_t *)&DAT_001f10fc,(matrix_t *)&DAT_001f120c);
    matT.field_0.m[0][0] = IVar40.x;
    matT.field_0.m[0][1] = IVar40.y;
    for (uVar27 = 0; uVar27 != 0x3f; uVar27 = uVar27 + 1) {
      matrix_t::RotationAxis
                (&matT_2,(vec_t *)&DAT_001f12ec,((float)(uVar27 & 0xffffffff) / 63.0) * DAT_001f132c
                );
      cumulativeDelta.x = DAT_001f131c;
      cumulativeDelta.y = DAT_001f131c._4_4_;
      cumulativeDelta.z = DAT_001f131c._8_4_;
      cumulativeDelta.w = DAT_001f131c._12_4_;
      vec_t::TransformPoint(&cumulativeDelta,&matT_2);
      cumulativeDelta.x = DAT_001f12d4 * cumulativeDelta.x;
      cumulativeDelta.y = DAT_001f12d4 * cumulativeDelta.y;
      cumulativeDelta.z = DAT_001f12d4 * cumulativeDelta.z;
      cumulativeDelta.w = DAT_001f12d4 * cumulativeDelta.w;
      vVar49 = vec_t::operator+(&cumulativeDelta,(vec_t *)&DAT_001f10fc);
      indices[0] = (int)vVar49.x;
      indices[1] = (int)vVar49.y;
      IVar40 = worldToPos((vec_t *)indices,(matrix_t *)&DAT_001f120c);
      *(ImVec2 *)((long)&matT.field_0 + uVar27 * 8 + 8) = IVar40;
    }
    ImDrawList::AddConvexPolyFilled(pIVar12,(ImVec2 *)&matT,0x40,0x801080ff,true);
    ImDrawList::AddPolyline(pIVar12,(ImVec2 *)&matT,0x40,0xff1080ff,true,2.0,true);
    uVar14 = matT.field_0.m[0][3];
    uVar19 = matT.field_0.m[0][2];
    buf = &matT_2;
    ImFormatString((char *)buf,0x200,
                   _ZN8ImGuizmoL16rotationInfoMaskE_rel +
                   *(int *)("XYZ : %5.2f" + (long)type * 4 + 2),
                   (double)((DAT_001f132c / 3.1415927) * 180.0),(double)DAT_001f132c);
    cumulativeDelta.x = (float)uVar19 + 15.0;
    cumulativeDelta.y = (float)uVar14 + 15.0;
    ImDrawList::AddText(pIVar12,(ImVec2 *)&cumulativeDelta,0xff000000,(char *)buf,(char *)0x0);
    cumulativeDelta.x = (float)uVar19 + 14.0;
    cumulativeDelta.y = (float)uVar14 + 14.0;
    pvVar24 = &cumulativeDelta;
  }
LAB_0012d8a6:
  ImDrawList::AddText(pIVar12,(ImVec2 *)pvVar24,0xffffffff,(char *)buf,(char *)0x0);
  return;
}

Assistant:

void Manipulate(const float *view, const float *projection, OPERATION operation, MODE mode, float *matrix, float *deltaMatrix, float *snap, float *localBounds, float *boundsSnap)
   {
      ComputeContext(view, projection, matrix, mode);

      // set delta to identity 
      if (deltaMatrix)
         ((matrix_t*)deltaMatrix)->SetToIdentity();

      // behind camera
      vec_t camSpacePosition;
      camSpacePosition.TransformPoint(makeVect(0.f, 0.f, 0.f), gContext.mMVP);
      if (camSpacePosition.z < 0.001f)
         return;

      // -- 
      int type = NONE;
      if (gContext.mbEnable)
      {
		  if (!gContext.mbUsingBounds)
		  {
			  switch (operation)
			  {
			  case ROTATE:
				  HandleRotation(matrix, deltaMatrix, type, snap);
				  break;
			  case TRANSLATE:
				  HandleTranslation(matrix, deltaMatrix, type, snap);
				  break;
			  case SCALE:
				  HandleScale(matrix, deltaMatrix, type, snap);
				  break;
			  }
		  }
      }

	  if (localBounds && !gContext.mbUsing)
		  HandleAndDrawLocalBounds(localBounds, (matrix_t*)matrix, boundsSnap);

	  if (!gContext.mbUsingBounds)
	  {
		  switch (operation)
		  {
		  case ROTATE:
			  DrawRotationGizmo(type);
			  break;
		  case TRANSLATE:
			  DrawTranslationGizmo(type);
			  break;
		  case SCALE:
			  DrawScaleGizmo(type);
			  break;
		  }
	  }
   }